

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biquad.cpp
# Opt level: O2

void __thiscall
BiquadFilterR<float>::process
          (BiquadFilterR<float> *this,span<const_float,_18446744073709551615UL> src,float *dst)

{
  float *pfVar1;
  float fVar2;
  float z2;
  float z1;
  float local_60;
  float local_5c;
  anon_class_40_7_dd82e948 local_58;
  
  local_58.a2 = this->mA2;
  local_5c = this->mZ1;
  local_58.z1 = &local_5c;
  local_60 = this->mZ2;
  local_58.z2 = &local_60;
  local_58.b0 = this->mB0;
  local_58.b1 = this->mB1;
  local_58.b2 = this->mB2;
  local_58.a1 = this->mA1;
  for (pfVar1 = src.mData; pfVar1 != src.mDataEnd; pfVar1 = pfVar1 + 1) {
    fVar2 = process::anon_class_40_7_dd82e948::operator()(&local_58,*pfVar1);
    *dst = fVar2;
    dst = dst + 1;
  }
  this->mZ1 = local_5c;
  this->mZ2 = local_60;
  return;
}

Assistant:

void BiquadFilterR<Real>::process(const al::span<const Real> src, Real *dst)
{
    const Real b0{mB0};
    const Real b1{mB1};
    const Real b2{mB2};
    const Real a1{mA1};
    const Real a2{mA2};
    Real z1{mZ1};
    Real z2{mZ2};

    /* Processing loop is Transposed Direct Form II. This requires less storage
     * compared to Direct Form I (only two delay components, instead of a four-
     * sample history; the last two inputs and outputs), and works better for
     * floating-point which favors summing similarly-sized values while being
     * less bothered by overflow.
     *
     * See: http://www.earlevel.com/main/2003/02/28/biquads/
     */
    auto proc_sample = [b0,b1,b2,a1,a2,&z1,&z2](Real input) noexcept -> Real
    {
        const Real output{input*b0 + z1};
        z1 = input*b1 - output*a1 + z2;
        z2 = input*b2 - output*a2;
        return output;
    };
    std::transform(src.cbegin(), src.cend(), dst, proc_sample);

    mZ1 = z1;
    mZ2 = z2;
}